

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O2

string * __thiscall
spvtools::val::(anonymous_namespace)::ReflectionInstructionName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,ValidationState_t *_,
          Instruction *inst)

{
  spv_result_t sVar1;
  spv_ext_inst_desc desc;
  ostringstream ss;
  
  desc = (spv_ext_inst_desc)0x0;
  sVar1 = AssemblyGrammar::lookupExtInst
                    ((AssemblyGrammar *)(this + 0x438),SPV_EXT_INST_TYPE_NONSEMANTIC_CLSPVREFLECTION
                     ,*(uint32_t *)&_->context_->operand_table,&desc);
  if ((sVar1 == SPV_SUCCESS) && (desc != (spv_ext_inst_desc)0x0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    std::operator<<((ostream *)&ss,desc->name);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Unknown ExtInst",(allocator<char> *)&ss);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ReflectionInstructionName(ValidationState_t& _,
                                      const Instruction* inst) {
  spv_ext_inst_desc desc = nullptr;
  if (_.grammar().lookupExtInst(SPV_EXT_INST_TYPE_NONSEMANTIC_CLSPVREFLECTION,
                                inst->word(4), &desc) != SPV_SUCCESS ||
      !desc) {
    return std::string("Unknown ExtInst");
  }
  std::ostringstream ss;
  ss << desc->name;

  return ss.str();
}